

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

void Diligent::
     FormatStrSS<std::__cxx11::stringstream,char[16],char_const*,char[4],char[20],unsigned_int,char[41],unsigned_int,char[6],char_const*>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss,
               char (*FirstArg) [16],char **RestArgs,char (*RestArgs_1) [4],char (*RestArgs_2) [20],
               uint *RestArgs_3,char (*RestArgs_4) [41],uint *RestArgs_5,char (*RestArgs_6) [6],
               char **RestArgs_7)

{
  uint *RestArgs_local_3;
  char (*RestArgs_local_2) [20];
  char (*RestArgs_local_1) [4];
  char **RestArgs_local;
  char (*FirstArg_local) [16];
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss_local;
  
  FormatStrSS<std::__cxx11::stringstream,char[16]>(ss,FirstArg);
  FormatStrSS<std::__cxx11::stringstream,char_const*,char[4],char[20],unsigned_int,char[41],unsigned_int,char[6],char_const*>
            (ss,RestArgs,RestArgs_1,RestArgs_2,RestArgs_3,RestArgs_4,RestArgs_5,RestArgs_6,
             RestArgs_7);
  return;
}

Assistant:

void FormatStrSS(SSType& ss, const FirstArgType& FirstArg, const RestArgsType&... RestArgs)
{
    FormatStrSS(ss, FirstArg);
    FormatStrSS(ss, RestArgs...); // recursive call using pack expansion syntax
}